

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ManLevelRNum(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int Fill;
  int Fill_00;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  lVar12 = (long)p->nObjs;
  if (lVar12 < 1) {
    iVar11 = 0;
  }
  else {
    uVar15 = lVar12 + 1;
    lVar12 = lVar12 * 0xc;
    do {
      uVar13 = uVar15 - 1;
      if ((long)p->nObjs < (long)uVar13) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar1 = (Gia_Obj_t *)(&pGVar3[-1].field_0x0 + lVar12);
      uVar10 = *(ulong *)pGVar1;
      uVar16 = (uint)uVar10;
      iVar11 = (int)uVar15;
      if (p->fGiaSimple == 0) {
        uVar7 = uVar10 & 0x80000000;
        if (((uVar7 != 0) || (uVar9 = uVar16 & 0x1fffffff, uVar9 == 0x1fffffff)) ||
           (uVar9 != ((uint)(uVar10 >> 0x20) & 0x1fffffff))) goto LAB_002404b3;
        pVVar4 = p->vLevels;
        Vec_IntFillExtra(pVVar4,(int)uVar13,0x1fffffff);
        if ((long)pVVar4->nSize < (long)uVar13) goto LAB_00240841;
        uVar10 = (uVar15 + -uVar9) - 2;
        iVar8 = (int)uVar10;
        if ((iVar8 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar8)) goto LAB_00240841;
        iVar14 = pVVar4->pArray[uVar15 - 2];
        uVar10 = uVar10 & 0xffffffff;
        iVar2 = pVVar5->pArray[uVar10];
        Vec_IntFillExtra(pVVar5,~uVar9 + iVar11,Fill_00);
        if (pVVar5->nSize <= iVar8) goto LAB_00240860;
        if (iVar14 < iVar2) {
          iVar14 = iVar2;
        }
        pVVar5->pArray[uVar10] = iVar14;
      }
      else {
        uVar7 = (ulong)(uVar16 & 0x80000000);
LAB_002404b3:
        iVar8 = (int)CONCAT71(0x1fffff,uVar7 != 0);
        if ((uVar10 & 0x1fffffff) == 0x1fffffff || uVar7 != 0) {
          if (uVar7 == 0 || (int)(uVar10 & 0x1fffffff) == 0x1fffffff) {
            iVar14 = p->nLevels;
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,iVar11 + -1,iVar8);
            if ((long)pVVar4->nSize < (long)uVar13) goto LAB_00240841;
            iVar11 = pVVar4->pArray[uVar15 - 2];
            if (pVVar4->pArray[uVar15 - 2] < iVar14) {
              iVar11 = iVar14;
            }
            p->nLevels = iVar11;
          }
          else {
            uVar15 = (uVar15 + -(uVar16 & 0x1fffffff)) - 2;
            iVar14 = (int)uVar15;
            if ((iVar14 < 0) || (pVVar4 = p->vLevels, pVVar4->nSize <= iVar14)) goto LAB_00240841;
            uVar15 = uVar15 & 0xffffffff;
            iVar2 = pVVar4->pArray[uVar15];
            Vec_IntFillExtra(pVVar4,~(uVar16 & 0x1fffffff) + iVar11,iVar8);
            if (pVVar4->nSize <= iVar14) goto LAB_00240860;
            if (iVar2 < 2) {
              iVar2 = 1;
            }
            pVVar4->pArray[uVar15] = iVar2;
          }
        }
        else {
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,(int)uVar13,iVar8);
          if ((long)pVVar4->nSize < (long)uVar13) {
LAB_00240841:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = (uVar15 + -(uVar16 & 0x1fffffff)) - 2;
          iVar8 = (int)uVar10;
          if ((iVar8 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar8)) goto LAB_00240841;
          iVar14 = pVVar4->pArray[uVar15 - 2];
          uVar10 = uVar10 & 0xffffffff;
          iVar2 = pVVar5->pArray[uVar10];
          Vec_IntFillExtra(pVVar5,~(uVar16 & 0x1fffffff) + iVar11,iVar8);
          if (pVVar5->nSize <= iVar8) {
LAB_00240860:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar14 = iVar14 + 1;
          if (iVar14 < iVar2) {
            iVar14 = iVar2;
          }
          pVVar5->pArray[uVar10] = iVar14;
          pGVar6 = p->pObjs;
          if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = *(uint *)&pGVar1->field_0x4 & 0x1fffffff;
          uVar16 = (int)((long)pGVar3 + ((lVar12 + -0xc) - (long)pGVar6) >> 2) * -0x55555555;
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,uVar16 + 1,0x1fffffff);
          if (((int)uVar16 < 0) || (pVVar4->nSize <= (int)uVar16)) goto LAB_00240841;
          uVar15 = (uVar15 + -uVar9) - 2;
          iVar8 = (int)uVar15;
          if ((iVar8 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar8)) goto LAB_00240841;
          iVar14 = pVVar4->pArray[uVar16 & 0x7fffffff];
          uVar15 = uVar15 & 0xffffffff;
          iVar2 = pVVar5->pArray[uVar15];
          Vec_IntFillExtra(pVVar5,~uVar9 + iVar11,Fill);
          if (pVVar5->nSize <= iVar8) goto LAB_00240860;
          iVar14 = iVar14 + 1;
          if (iVar14 < iVar2) {
            iVar14 = iVar2;
          }
          pVVar5->pArray[uVar15] = iVar14;
        }
      }
      uVar15 = uVar13;
      lVar12 = lVar12 + -0xc;
    } while (1 < uVar13);
    iVar11 = p->nLevels;
  }
  return iVar11;
}

Assistant:

int Gia_ManLevelRNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), Gia_ObjLevel(p, pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1+Gia_ObjLevel(p, pObj) );
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId1(pObj, i), 1+Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1 );
        else
            p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}